

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

uint __thiscall EOPlus::Parser::ParseVersion(Parser *this)

{
  int iVar1;
  Parser_Token_Server_Base *pPVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Parser_Error *pPVar6;
  Token *t_00;
  Token *t_01;
  uint uVar7;
  allocator<char> local_1f9;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  Token t;
  undefined1 local_100 [64];
  Token local_c0;
  Token local_70;
  
  util::variant::variant((variant *)local_100);
  Token::Token(&t,Invalid,(variant *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 0x10));
  bVar3 = GetToken(this,&t,4);
  if (!bVar3) {
    pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"Expected number after \'version\'",&local_1f9);
    std::operator+(&local_1b8,&local_1d8," Got: ");
    Token::Token(&local_c0,
                 &((this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                  reject_token);
    token_got_string_abi_cxx11_(&local_1f8,(EOPlus *)&local_c0,t_00);
    std::operator+(&local_198,&local_1b8,&local_1f8);
    pPVar2 = (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
    iVar4 = pPVar2->line;
    iVar1 = pPVar2->reject_line;
    if (iVar1 < iVar4) {
      iVar1 = iVar4;
    }
    Parser_Error::Parser_Error(pPVar6,&local_198,iVar1);
    __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = util::variant::GetInt(&t.data);
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:151:28)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:151:28)>
              ::_M_manager;
  bVar3 = GetTokenIf(this,&t,(function<bool_(const_EOPlus::Token_&)> *)&local_178,0x40);
  uVar7 = iVar4 << 0x10;
  std::_Function_base::~_Function_base((_Function_base *)&local_178);
  if (bVar3) {
    bVar3 = GetToken(this,&t,4);
    if (!bVar3) {
      pPVar6 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"Expected number after \'.\' in version.",&local_1f9);
      std::operator+(&local_1b8,&local_1d8," Got: ");
      Token::Token(&local_70,
                   &((this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)
                    ->reject_token);
      token_got_string_abi_cxx11_(&local_1f8,(EOPlus *)&local_70,t_01);
      std::operator+(&local_198,&local_1b8,&local_1f8);
      pPVar2 = (this->tok)._M_t.
               super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ._M_t.
               super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
      iVar4 = pPVar2->line;
      iVar1 = pPVar2->reject_line;
      if (iVar1 < iVar4) {
        iVar1 = iVar4;
      }
      Parser_Error::Parser_Error(pPVar6,&local_198,iVar1);
      __cxa_throw(pPVar6,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = util::variant::GetInt(&t.data);
    uVar7 = uVar7 | uVar5 & 0xffff;
  }
  std::__cxx11::string::~string((string *)&t.data.val_string);
  return uVar7;
}

Assistant:

unsigned int Parser::ParseVersion()
	{
		typedef unsigned int ui;
		unsigned int version = 0;
		Token t;

		if (this->GetToken(t, Token::Integer))
		{
			version += ui(int(t.data)) << 16;

			if (this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
			{
				if (this->GetToken(t, Token::Integer))
					version |= ui(int(t.data)) & 0xFFFF;
				else
					PARSER_ERROR_GOT("Expected number after '.' in version.");
			}
		}
		else
		{
			PARSER_ERROR_GOT("Expected number after 'version'");
		}

		return version;
	}